

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFileArtifactResultGetter<ArtifactLinkerLibraryFilePrefixTag>::Get_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFileArtifactResultGetter<ArtifactLinkerLibraryFilePrefixTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content)

{
  bool bVar1;
  TargetType TVar2;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  bVar1 = cmGeneratorTarget::IsLinkable((cmGeneratorTarget *)this);
  if ((bVar1) &&
     (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this), TVar2 != EXECUTABLE)) {
    bVar1 = cmGeneratorTarget::IsDLLPlatform((cmGeneratorTarget *)this);
    if ((!bVar1) ||
       (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this), TVar2 == STATIC_LIBRARY)) {
      cmGeneratorTarget::GetFilePrefix
                (__return_storage_ptr__,(cmGeneratorTarget *)this,
                 (string *)&(target->LinkOptionsCache)._M_t._M_impl.super__Rb_tree_header,
                 RuntimeBinaryArtifact);
      return __return_storage_ptr__;
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_40,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "TARGET_LINKER_LIBRARY_FILE_PREFIX is allowed only for libraries with ENABLE_EXPORTS."
               ,&local_61);
    reportError((cmGeneratorExpressionContext *)target,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Get(cmGeneratorTarget* target,
                         cmGeneratorExpressionContext* context,
                         const GeneratorExpressionContent* content)
  {
    if (!target->IsLinkable() ||
        target->GetType() == cmStateEnums::EXECUTABLE) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_LINKER_LIBRARY_FILE_PREFIX is allowed only for libraries "
        "with ENABLE_EXPORTS.");
      return std::string();
    }

    if (!target->IsDLLPlatform() ||
        target->GetType() == cmStateEnums::STATIC_LIBRARY) {
      return target->GetFilePrefix(context->Config,
                                   cmStateEnums::RuntimeBinaryArtifact);
    }
    return std::string{};
  }